

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priolist.c
# Opt level: O1

void nn_priolist_advance(nn_priolist *self,int release)

{
  int iVar1;
  nn_list_item *pnVar2;
  long lVar3;
  nn_priolist_data *pnVar4;
  nn_list *self_00;
  
  lVar3 = (long)self->current;
  if (lVar3 < 1) {
    nn_priolist_advance_cold_1();
  }
  self_00 = &self->slots[lVar3 + -1].pipes;
  pnVar2 = &(self->slots[lVar3 + -1].current)->item;
  if (release == 0) {
    pnVar2 = nn_list_next(self_00,pnVar2);
  }
  else {
    pnVar2 = nn_list_erase(self_00,pnVar2);
  }
  if (pnVar2 == (nn_list_item *)0x0) {
    pnVar2 = nn_list_begin(self_00);
  }
  pnVar4 = (nn_priolist_data *)(pnVar2 + -1);
  if (pnVar2 == (nn_list_item *)0x0) {
    pnVar4 = (nn_priolist_data *)0x0;
  }
  self->slots[lVar3 + -1].current = pnVar4;
  while( true ) {
    iVar1 = nn_list_empty(self_00);
    if (iVar1 == 0) {
      return;
    }
    iVar1 = self->current;
    self->current = iVar1 + 1;
    if (0xf < (long)iVar1) break;
    self_00 = &self->slots[iVar1].pipes;
  }
  self->current = -1;
  return;
}

Assistant:

void nn_priolist_advance (struct nn_priolist *self, int release)
{
    struct nn_priolist_slot *slot;
    struct nn_list_item *it;

    nn_assert (self->current > 0);
    slot = &self->slots [self->current - 1];

    /*  Move slot's current pointer to the next pipe. */
    if (release)
        it = nn_list_erase (&slot->pipes, &slot->current->item);
    else
        it = nn_list_next (&slot->pipes, &slot->current->item);
    if (!it)
        it = nn_list_begin (&slot->pipes);
    slot->current = nn_cont (it, struct nn_priolist_data, item);

    /* If there are no more pipes in this slot, find a non-empty slot with
       lower priority. */
    while (nn_list_empty (&slot->pipes)) {
        ++self->current;
        if (self->current > NN_PRIOLIST_SLOTS) {
            self->current = -1;
            return;
        }
        slot = &self->slots [self->current - 1];
    }
}